

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

RegisterList * set_used_register(Context *ctx,RegisterType regtype,int regnum,int written)

{
  RegisterList *pRVar1;
  
  if (0 < regnum && regtype == REG_TYPE_COLOROUT) {
    ctx->have_multi_color_outputs = 1;
  }
  pRVar1 = reglist_insert(ctx,&ctx->used_registers,regtype,regnum);
  if (written != 0 && pRVar1 != (RegisterList *)0x0) {
    pRVar1->written = 1;
  }
  return pRVar1;
}

Assistant:

static inline RegisterList *set_used_register(Context *ctx,
                                              const RegisterType regtype,
                                              const int regnum,
                                              const int written)
{
    RegisterList *reg = NULL;
    if ((regtype == REG_TYPE_COLOROUT) && (regnum > 0))
        ctx->have_multi_color_outputs = 1;

    reg = reglist_insert(ctx, &ctx->used_registers, regtype, regnum);
    if (reg && written)
        reg->written = 1;
    return reg;
}